

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O2

int __thiscall QObjectCleanupHandler::remove(QObjectCleanupHandler *this,char *__filename)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QObject *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QObject *)__filename;
  qVar1 = QtPrivate::indexOf<QObject*,QObject*>((QList<QObject_*> *)(this + 0x10),&local_20,0);
  if ((int)qVar1 != -1) {
    QList<QObject_*>::removeAt((QList<QObject_*> *)(this + 0x10),(long)(int)qVar1);
    QObject::disconnect(local_20,"2destroyed(QObject*)",(QObject *)this,"1objectDestroyed(QObject*)"
                       );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QObjectCleanupHandler::remove(QObject *object)
{
    int index;
    if ((index = cleanupObjects.indexOf(object)) != -1) {
        cleanupObjects.removeAt(index);
        disconnect(object, SIGNAL(destroyed(QObject*)), this, SLOT(objectDestroyed(QObject*)));
    }
}